

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O1

void xmlSetTreeDoc(xmlNodePtr tree,xmlDocPtr doc)

{
  xmlDocPtr pxVar1;
  xmlChar *pxVar2;
  _xmlDict *oldDict;
  _xmlDict *newDict;
  _xmlAttr *attr;
  _xmlNode *tree_00;
  _xmlDict *oldDict_00;
  
  if (((tree != (xmlNodePtr)0x0) && (tree->type != XML_NAMESPACE_DECL)) &&
     (pxVar1 = tree->doc, pxVar1 != doc)) {
    if (pxVar1 == (xmlDocPtr)0x0) {
      oldDict_00 = (xmlDictPtr)0x0;
    }
    else {
      oldDict_00 = pxVar1->dict;
    }
    if (doc == (xmlDocPtr)0x0) {
      newDict = (xmlDictPtr)0x0;
    }
    else {
      newDict = doc->dict;
    }
    if (tree->type == XML_ELEMENT_NODE) {
      for (attr = tree->properties; attr != (xmlAttrPtr)0x0; attr = attr->next) {
        if (attr->atype == XML_ATTRIBUTE_ID) {
          xmlRemoveID(tree->doc,attr);
        }
        pxVar1 = attr->doc;
        if (pxVar1 != doc) {
          if (pxVar1 == (xmlDocPtr)0x0) {
            oldDict = (xmlDictPtr)0x0;
          }
          else {
            oldDict = pxVar1->dict;
          }
          pxVar2 = _copyStringForNewDictIfNeeded(oldDict,newDict,attr->name);
          attr->name = pxVar2;
          attr->doc = doc;
        }
        xmlSetListDoc(attr->children,doc);
      }
    }
    if (tree->type == XML_ENTITY_REF_NODE) {
      tree->children = (_xmlNode *)0x0;
    }
    else {
      tree_00 = tree->children;
      if ((tree_00 != (_xmlNode *)0x0) && (tree_00->type != XML_NAMESPACE_DECL)) {
        do {
          if (tree_00->doc != doc) {
            xmlSetTreeDoc(tree_00,doc);
          }
          tree_00 = tree_00->next;
        } while (tree_00 != (_xmlNode *)0x0);
      }
    }
    pxVar2 = _copyStringForNewDictIfNeeded(oldDict_00,newDict,tree->name);
    tree->name = pxVar2;
    pxVar2 = _copyStringForNewDictIfNeeded(oldDict_00,(xmlDictPtr)0x0,tree->content);
    tree->content = pxVar2;
    tree->doc = doc;
  }
  return;
}

Assistant:

void
xmlSetTreeDoc(xmlNodePtr tree, xmlDocPtr doc) {
    xmlAttrPtr prop;

    if ((tree == NULL) || (tree->type == XML_NAMESPACE_DECL))
	return;
    if (tree->doc != doc) {
        xmlDictPtr oldTreeDict = tree->doc ? tree->doc->dict : NULL;
        xmlDictPtr newDict = doc ? doc->dict : NULL;

	if(tree->type == XML_ELEMENT_NODE) {
	    prop = tree->properties;
	    while (prop != NULL) {
                if (prop->atype == XML_ATTRIBUTE_ID) {
                    xmlRemoveID(tree->doc, prop);
                }

                if (prop->doc != doc) {
                    xmlDictPtr oldPropDict = prop->doc ? prop->doc->dict : NULL;
                    prop->name = _copyStringForNewDictIfNeeded(oldPropDict, newDict, prop->name);
                    prop->doc = doc;
                }
		xmlSetListDoc(prop->children, doc);

                /*
                 * TODO: ID attributes should be also added to the new
                 * document, but this breaks things like xmlReplaceNode.
                 * The underlying problem is that xmlRemoveID is only called
                 * if a node is destroyed, not if it's unlinked.
                 */
#if 0
                if (xmlIsID(doc, tree, prop)) {
                    xmlChar *idVal = xmlNodeListGetString(doc, prop->children,
                                                          1);
                    xmlAddID(NULL, doc, idVal, prop);
                }
#endif

		prop = prop->next;
	    }
	}
        if (tree->type == XML_ENTITY_REF_NODE) {
            /*
             * Clear 'children' which points to the entity declaration
             * from the original document.
             */
            tree->children = NULL;
        } else if (tree->children != NULL) {
	    xmlSetListDoc(tree->children, doc);
        }

        tree->name = _copyStringForNewDictIfNeeded(oldTreeDict, newDict, tree->name);
        tree->content = (xmlChar *)_copyStringForNewDictIfNeeded(oldTreeDict, NULL, tree->content);
        /* FIXME: tree->ns should be updated as in xmlStaticCopyNode(). */
	tree->doc = doc;
    }
}